

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::decodeHDREndpointMode15
               (UVec4 *e0,UVec4 *e1,deUint32 v0,deUint32 v1,deUint32 v2,deUint32 v3,deUint32 v4,
               deUint32 v5,deUint32 v6In,deUint32 v7In)

{
  byte bVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  deInt32 v7;
  deInt32 v6;
  deUint32 mode;
  deUint32 v3_local;
  deUint32 v2_local;
  deUint32 v1_local;
  deUint32 v0_local;
  UVec4 *e1_local;
  UVec4 *e0_local;
  
  decodeHDREndpointMode11(e0,e1,v0,v1,v2,v3,v4,v5);
  dVar2 = getBit(v7In,7);
  dVar3 = getBit(v6In,7);
  uVar4 = dVar2 << 1 | dVar3;
  dVar2 = getBits(v6In,0,6);
  dVar3 = getBits(v7In,0,6);
  if (uVar4 == 3) {
    puVar6 = Vector<unsigned_int,_4>::w(e0);
    *puVar6 = dVar2 << 5;
    puVar6 = Vector<unsigned_int,_4>::w(e1);
    *puVar6 = dVar3 << 5;
  }
  else {
    bVar1 = (byte)uVar4;
    uVar4 = (dVar3 << (bVar1 + 1 & 0x1f) & 0x780 | dVar2) << (4 - bVar1 & 0x1f);
    uVar5 = de::clamp<int>(uVar4 + ((0x20 >> (bVar1 & 0x1f) ^ 0x3f >> (bVar1 & 0x1f) & dVar3) -
                                    (0x20 >> (bVar1 & 0x1f)) << (4 - bVar1 & 0x1f)),0,0xfff);
    puVar6 = Vector<unsigned_int,_4>::w(e0);
    *puVar6 = uVar4;
    puVar6 = Vector<unsigned_int,_4>::w(e1);
    *puVar6 = uVar5;
  }
  return;
}

Assistant:

void decodeHDREndpointMode15(UVec4& e0, UVec4& e1, deUint32 v0, deUint32 v1, deUint32 v2, deUint32 v3, deUint32 v4, deUint32 v5, deUint32 v6In, deUint32 v7In)
{
	decodeHDREndpointMode11(e0, e1, v0, v1, v2, v3, v4, v5);

	const deUint32	mode	= (getBit(v7In, 7) << 1) | getBit(v6In, 7);
	deInt32			v6		= (deInt32)getBits(v6In, 0, 6);
	deInt32			v7		= (deInt32)getBits(v7In, 0, 6);

	if (mode == 3)
	{
		e0.w() = v6 << 5;
		e1.w() = v7 << 5;
	}
	else
	{
		v6 |= (v7 << (mode+1)) & 0x780;
		v7 &= (0x3f >> mode);
		v7 ^= 0x20 >> mode;
		v7 -= 0x20 >> mode;
		v6 <<= 4-mode;
		v7 <<= 4-mode;

		v7 += v6;
		v7 = de::clamp(v7, 0, 0xfff);
		e0.w() = v6;
		e1.w() = v7;
	}
}